

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracy_lz4.cpp
# Opt level: O0

int tracy::LZ4_saveDict(LZ4_stream_t *LZ4_dict,char *safeBuffer,int dictSize)

{
  BYTE *previousDictEnd;
  LZ4_stream_t_internal *dict;
  int dictSize_local;
  char *safeBuffer_local;
  LZ4_stream_t *LZ4_dict_local;
  
  dict._4_4_ = dictSize;
  if (0x10000 < (uint)dictSize) {
    dict._4_4_ = 0x10000;
  }
  if ((LZ4_dict->internal_donotuse).dictSize < dict._4_4_) {
    dict._4_4_ = (LZ4_dict->internal_donotuse).dictSize;
  }
  if (0 < (int)dict._4_4_) {
    memmove(safeBuffer,
            (LZ4_dict->internal_donotuse).dictionary +
            ((ulong)(LZ4_dict->internal_donotuse).dictSize - (long)(int)dict._4_4_),
            (long)(int)dict._4_4_);
  }
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)safeBuffer;
  (LZ4_dict->internal_donotuse).dictSize = dict._4_4_;
  return dict._4_4_;
}

Assistant:

int LZ4_saveDict (LZ4_stream_t* LZ4_dict, char* safeBuffer, int dictSize)
{
    LZ4_stream_t_internal* const dict = &LZ4_dict->internal_donotuse;
    const BYTE* const previousDictEnd = dict->dictionary + dict->dictSize;

    if ((U32)dictSize > 64 KB) { dictSize = 64 KB; } /* useless to define a dictionary > 64 KB */
    if ((U32)dictSize > dict->dictSize) { dictSize = (int)dict->dictSize; }

    if (safeBuffer == NULL) assert(dictSize == 0);
    if (dictSize > 0)
        memmove(safeBuffer, previousDictEnd - dictSize, dictSize);

    dict->dictionary = (const BYTE*)safeBuffer;
    dict->dictSize = (U32)dictSize;

    return dictSize;
}